

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

int __thiscall
alex::AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>::expand
          (AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_> *this,
          int log2_expansion_factor)

{
  long lVar1;
  int iVar2;
  new_allocator<alex::AlexNode<double,_double>_*> *this_00;
  uint in_ESI;
  size_type in_RDI;
  int i;
  int cur_child_repeats;
  AlexNode<double,_double> *cur_child;
  int cur;
  AlexNode<double,_double> **new_children;
  int num_new_children;
  int expansion_factor;
  AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_> *this_01;
  void *in_stack_ffffffffffffffa0;
  new_allocator<alex::AlexNode<double,_double>_*> *in_stack_ffffffffffffffb0;
  int local_48;
  int local_38;
  new_allocator<alex::AlexNode<double,_double>_*> *local_20;
  int local_14;
  int local_10;
  char local_c;
  
  if (-1 < (int)in_ESI) {
    local_10 = 1 << (in_ESI & 0x1f);
    local_14 = *(int *)(in_RDI + 0x30) * local_10;
    this_01 = (AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_> *)
              &stack0xffffffffffffffdf;
    _local_c = in_ESI;
    pointer_allocator(this_01);
    this_00 = (new_allocator<alex::AlexNode<double,_double>_*> *)
              __gnu_cxx::new_allocator<alex::AlexNode<double,_double>_*>::allocate
                        (in_stack_ffffffffffffffb0,in_RDI,in_stack_ffffffffffffffa0);
    std::allocator<alex::AlexNode<double,_double>_*>::~allocator
              ((allocator<alex::AlexNode<double,_double>_*> *)0x125337);
    for (local_38 = 0; local_38 < *(int *)(in_RDI + 0x30); local_38 = iVar2 + local_38) {
      lVar1 = *(long *)(*(long *)(in_RDI + 0x38) + (long)local_38 * 8);
      iVar2 = 1 << (*(byte *)(lVar1 + 9) & 0x1f);
      for (local_48 = local_10 * local_38; local_48 < local_10 * (local_38 + iVar2);
          local_48 = local_48 + 1) {
        *(long *)(this_00 + (long)local_48 * 8) = lVar1;
      }
      *(char *)(lVar1 + 9) = *(char *)(lVar1 + 9) + local_c;
    }
    local_20 = this_00;
    pointer_allocator(this_01);
    __gnu_cxx::new_allocator<alex::AlexNode<double,_double>_*>::deallocate
              (this_00,(AlexNode<double,_double> **)this_01,0x125430);
    std::allocator<alex::AlexNode<double,_double>_*>::~allocator
              ((allocator<alex::AlexNode<double,_double>_*> *)0x12543a);
    *(new_allocator<alex::AlexNode<double,_double>_*> **)(in_RDI + 0x38) = local_20;
    *(int *)(in_RDI + 0x30) = local_14;
    LinearModel<double>::expand((LinearModel<double> *)(in_RDI + 0x10),(double)local_10);
    return local_10;
  }
  __assert_fail("log2_expansion_factor >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex_nodes.h"
                ,0x77,
                "int alex::AlexModelNode<double, double>::expand(int) [T = double, P = double, Alloc = std::allocator<std::pair<double, double>>]"
               );
}

Assistant:

int expand(int log2_expansion_factor) {
    assert(log2_expansion_factor >= 0);
    int expansion_factor = 1 << log2_expansion_factor;
    int num_new_children = num_children_ * expansion_factor;
    auto new_children = new (pointer_allocator().allocate(num_new_children))
        AlexNode<T, P>*[num_new_children];
    int cur = 0;
    while (cur < num_children_) {
      AlexNode<T, P>* cur_child = children_[cur];
      int cur_child_repeats = 1 << cur_child->duplication_factor_;
      for (int i = expansion_factor * cur;
           i < expansion_factor * (cur + cur_child_repeats); i++) {
        new_children[i] = cur_child;
      }
      cur_child->duplication_factor_ += log2_expansion_factor;
      cur += cur_child_repeats;
    }
    pointer_allocator().deallocate(children_, num_children_);
    children_ = new_children;
    num_children_ = num_new_children;
    this->model_.expand(expansion_factor);
    return expansion_factor;
  }